

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.c
# Opt level: O2

int check_flag(char *flag,int argc,char **argv)

{
  int iVar1;
  char short_flag [3];
  int index;
  option long_options [2];
  
  index = 0;
  short_flag[0] = '+';
  short_flag[1] = ':';
  short_flag[2] = *flag;
  _optind = 0;
  long_options[0].has_arg = 0;
  long_options[0]._12_4_ = 0;
  long_options[1].flag = (int *)0x0;
  long_options[1].val = 0;
  long_options[1]._28_4_ = 0;
  long_options[1].name = (char *)0x0;
  long_options[1].has_arg = 0;
  long_options[1]._12_4_ = 0;
  long_options[0].flag = (int *)0x0;
  long_options[0]._28_4_ = 0;
  long_options[0].val = (int)*flag;
  long_options[0].name = flag;
  do {
    iVar1 = getopt_long(argc,argv,short_flag,long_options,&index);
    if (iVar1 == *flag) {
      return 1;
    }
  } while (iVar1 != -1);
  return 0;
}

Assistant:

int check_flag(const char *flag, int argc, char *argv[]) {
	// For getopt long options
	int index = 0;
	// The char returned by getopt()
	int option;
	// Setting the first character to be a plus
	// prevents getopt() from reordering the vector,
	// setting the second character to be a colon
	// prevents getopt() from printing an error
	// message when it encounters invalid options
	char short_flag[3] = {'+', ':', flag[0]};

	// Reset getopt index
	optind = 0;

	// clang-format off
	struct option long_options [2] = {
		{flag, no_argument, NULL, flag[0]},
		{0,    0,           0,    0}
	};
	// clang-format on

	while (true) {
		option = getopt_long(argc, argv, short_flag, long_options, &index);

		if (option == flag[0]) {
			return true;
		} else if (option == -1) {
			break;
		}
	}

	return false;
}